

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_PCI.H
# Opt level: O1

void __thiscall
amrex::FabArray<amrex::CutFab>::PC_local_cpu
          (FabArray<amrex::CutFab> *this,CPC *thecpc,FabArray<amrex::CutFab> *src,int scomp,
          int dcomp,int ncomp,CpOp op)

{
  Box *pBVar1;
  vector<amrex::FabCopyTag<amrex::CutFab>,std::allocator<amrex::FabCopyTag<amrex::CutFab>>> *this_00
  ;
  vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_> *pvVar2;
  BaseFab<double> *src_00;
  BaseFab<double> *this_01;
  iterator __position;
  pointer pFVar3;
  CutFab *pCVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  pointer pVVar7;
  Long LVar8;
  int iVar9;
  bool bVar10;
  int iVar11;
  int *piVar12;
  long lVar13;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  FabCopyTag<amrex::CutFab> *tag;
  pointer pFVar17;
  const_iterator __end0;
  Array4<double> dfab;
  MFIter mfi;
  LayoutData<amrex::Vector<amrex::FabCopyTag<amrex::CutFab>,_std::allocator<amrex::FabCopyTag<amrex::CutFab>_>_>_>
  loc_copy_tags;
  anon_class_152_5_ce3dc6ec local_278;
  Array4<double> local_1e0;
  MFIter local_1a0;
  LayoutData<amrex::Vector<amrex::FabCopyTag<amrex::CutFab>,_std::allocator<amrex::FabCopyTag<amrex::CutFab>_>_>_>
  local_140;
  
  pvVar2 = (thecpc->super_CommMetaData).m_LocTags._M_t.
           super___uniq_ptr_impl<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
           .
           super__Head_base<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_false>
           ._M_head_impl;
  uVar15 = (uint)((ulong)((long)*(pointer *)
                                 ((long)&(pvVar2->
                                         super__Vector_base<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                                         )._M_impl + 8) -
                         *(long *)&(pvVar2->
                                   super__Vector_base<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                                   )._M_impl) >> 6);
  if (uVar15 != 0) {
    if ((thecpc->super_CommMetaData).m_threadsafe_loc == true) {
      if (0 < (int)uVar15) {
        uVar16 = (ulong)(uVar15 & 0x7fffffff);
        lVar13 = 0;
        do {
          lVar14 = *(long *)&(((thecpc->super_CommMetaData).m_LocTags._M_t.
                               super___uniq_ptr_impl<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
                               .
                               super__Head_base<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_false>
                              ._M_head_impl)->
                             super__Vector_base<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                             )._M_impl;
          pBVar1 = (Box *)(lVar13 + lVar14);
          if (((this != src) ||
              (*(int *)(lVar14 + 0x38 + lVar13) != *(int *)(lVar14 + 0x3c + lVar13))) ||
             (bVar10 = Box::operator==((Box *)(lVar13 + lVar14 + 0x1c),pBVar1), !bVar10)) {
            iVar11 = FabArrayBase::localindex
                               (&src->super_FabArrayBase,*(int *)(lVar14 + 0x3c + lVar13));
            src_00 = (BaseFab<double> *)
                     (src->m_fabs_v).
                     super__Vector_base<amrex::CutFab_*,_std::allocator<amrex::CutFab_*>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar11];
            iVar11 = FabArrayBase::localindex
                               (&this->super_FabArrayBase,*(int *)(lVar14 + 0x38 + lVar13));
            this_01 = (BaseFab<double> *)
                      (this->m_fabs_v).
                      super__Vector_base<amrex::CutFab_*,_std::allocator<amrex::CutFab_*>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar11];
            if (op == COPY) {
              if (this_01->dptr != (double *)0x0) {
                BaseFab<double>::copy<(amrex::RunOn)1>
                          (this_01,src_00,(Box *)(lVar13 + lVar14 + 0x1c),scomp,pBVar1,dcomp,ncomp);
              }
            }
            else {
              BaseFab<double>::plus<(amrex::RunOn)1>
                        (this_01,src_00,(Box *)(lVar13 + lVar14 + 0x1c),pBVar1,scomp,dcomp,ncomp);
            }
          }
          lVar13 = lVar13 + 0x40;
          uVar16 = uVar16 - 1;
        } while (uVar16 != 0);
      }
    }
    else {
      LayoutData<amrex::Vector<amrex::FabCopyTag<amrex::CutFab>,_std::allocator<amrex::FabCopyTag<amrex::CutFab>_>_>_>
      ::LayoutData(&local_140,&(this->super_FabArrayBase).boxarray,
                   &(this->super_FabArrayBase).distributionMap);
      if (0 < (int)uVar15) {
        uVar16 = (ulong)(uVar15 & 0x7fffffff);
        lVar13 = 0;
        do {
          lVar14 = *(long *)&(((thecpc->super_CommMetaData).m_LocTags._M_t.
                               super___uniq_ptr_impl<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
                               .
                               super__Head_base<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_false>
                              ._M_head_impl)->
                             super__Vector_base<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                             )._M_impl;
          pBVar1 = (Box *)(lVar13 + lVar14);
          if (((this != src) ||
              (*(int *)(lVar14 + 0x38 + lVar13) != *(int *)(lVar14 + 0x3c + lVar13))) ||
             (bVar10 = Box::operator==((Box *)(lVar13 + lVar14 + 0x1c),pBVar1), !bVar10)) {
            iVar11 = FabArrayBase::localindex
                               (&local_140.super_FabArrayBase,*(int *)(lVar14 + 0x38 + lVar13));
            this_00 = (vector<amrex::FabCopyTag<amrex::CutFab>,std::allocator<amrex::FabCopyTag<amrex::CutFab>>>
                       *)(local_140.m_data.
                          super_vector<amrex::Vector<amrex::FabCopyTag<amrex::CutFab>,_std::allocator<amrex::FabCopyTag<amrex::CutFab>_>_>,_std::allocator<amrex::Vector<amrex::FabCopyTag<amrex::CutFab>,_std::allocator<amrex::FabCopyTag<amrex::CutFab>_>_>_>_>
                          .
                          super__Vector_base<amrex::Vector<amrex::FabCopyTag<amrex::CutFab>,_std::allocator<amrex::FabCopyTag<amrex::CutFab>_>_>,_std::allocator<amrex::Vector<amrex::FabCopyTag<amrex::CutFab>,_std::allocator<amrex::FabCopyTag<amrex::CutFab>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + iVar11);
            iVar11 = FabArrayBase::localindex
                               (&src->super_FabArrayBase,*(int *)(lVar14 + 0x3c + lVar13));
            local_278.dfab.p =
                 (double *)
                 (src->m_fabs_v).
                 super__Vector_base<amrex::CutFab_*,_std::allocator<amrex::CutFab_*>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar11];
            local_278.dfab.jstride = *(Long *)(pBVar1->smallend).vect;
            uVar5 = *(undefined8 *)((pBVar1->smallend).vect + 2);
            uVar6 = *(undefined8 *)((pBVar1->bigend).vect + 2);
            local_278.dfab.nstride._0_4_ =
                 (undefined4)((ulong)*(undefined8 *)(pBVar1->bigend).vect >> 0x20);
            local_278.dfab.nstride._4_4_ = (undefined4)uVar6;
            local_278.dfab.begin.x = (int)((ulong)uVar6 >> 0x20);
            local_278.dfab.kstride._0_4_ = (undefined4)uVar5;
            local_278.dfab.kstride._4_4_ = (undefined4)((ulong)uVar5 >> 0x20);
            local_278.dfab.begin.y = *(int *)(lVar14 + 0x1c + lVar13) - *(int *)(lVar14 + lVar13);
            local_278.dfab.begin.z =
                 *(int *)(lVar14 + 0x20 + lVar13) - *(int *)(lVar14 + 4 + lVar13);
            local_278.dfab.end.x = *(int *)(lVar14 + 0x24 + lVar13) - *(int *)(lVar14 + 8 + lVar13);
            __position._M_current = *(FabCopyTag<amrex::CutFab> **)(this_00 + 8);
            if (__position._M_current == *(FabCopyTag<amrex::CutFab> **)(this_00 + 0x10)) {
              std::
              vector<amrex::FabCopyTag<amrex::CutFab>,std::allocator<amrex::FabCopyTag<amrex::CutFab>>>
              ::_M_realloc_insert<amrex::FabCopyTag<amrex::CutFab>>
                        (this_00,__position,(FabCopyTag<amrex::CutFab> *)&local_278);
            }
            else {
              *(ulong *)&((__position._M_current)->dbox).btype =
                   CONCAT44(local_278.dfab.begin.y,local_278.dfab.begin.x);
              *(ulong *)(((__position._M_current)->offset).vect + 1) =
                   CONCAT44(local_278.dfab.end.x,local_278.dfab.begin.z);
              *(undefined8 *)(((__position._M_current)->dbox).smallend.vect + 2) = uVar5;
              *(ulong *)(((__position._M_current)->dbox).bigend.vect + 1) =
                   CONCAT44(local_278.dfab.nstride._4_4_,(undefined4)local_278.dfab.nstride);
              (__position._M_current)->sfab = (CutFab *)local_278.dfab.p;
              *(Long *)((__position._M_current)->dbox).smallend.vect = local_278.dfab.jstride;
              *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x30;
            }
          }
          lVar13 = lVar13 + 0x40;
          uVar16 = uVar16 - 1;
        } while (uVar16 != 0);
      }
      MFIter::MFIter(&local_1a0,&this->super_FabArrayBase,'\0');
      if (local_1a0.currentIndex < local_1a0.endIndex) {
        do {
          pVVar7 = local_140.m_data.
                   super_vector<amrex::Vector<amrex::FabCopyTag<amrex::CutFab>,_std::allocator<amrex::FabCopyTag<amrex::CutFab>_>_>,_std::allocator<amrex::Vector<amrex::FabCopyTag<amrex::CutFab>,_std::allocator<amrex::FabCopyTag<amrex::CutFab>_>_>_>_>
                   .
                   super__Vector_base<amrex::Vector<amrex::FabCopyTag<amrex::CutFab>,_std::allocator<amrex::FabCopyTag<amrex::CutFab>_>_>,_std::allocator<amrex::Vector<amrex::FabCopyTag<amrex::CutFab>,_std::allocator<amrex::FabCopyTag<amrex::CutFab>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          piVar12 = &local_1a0.currentIndex;
          if (local_1a0.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
            piVar12 = ((local_1a0.local_index_map)->super_vector<int,_std::allocator<int>_>).
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start + local_1a0.currentIndex;
          }
          iVar11 = *piVar12;
          array<amrex::CutFab,_0>(&local_1e0,this,&local_1a0);
          pFVar17 = pVVar7[iVar11].
                    super_vector<amrex::FabCopyTag<amrex::CutFab>,_std::allocator<amrex::FabCopyTag<amrex::CutFab>_>_>
                    .
                    super__Vector_base<amrex::FabCopyTag<amrex::CutFab>,_std::allocator<amrex::FabCopyTag<amrex::CutFab>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pFVar3 = pVVar7[iVar11].
                   super_vector<amrex::FabCopyTag<amrex::CutFab>,_std::allocator<amrex::FabCopyTag<amrex::CutFab>_>_>
                   .
                   super__Vector_base<amrex::FabCopyTag<amrex::CutFab>,_std::allocator<amrex::FabCopyTag<amrex::CutFab>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pCVar4 = (CutFab *)local_278.dfab.p;
          LVar8 = local_278.dfab.jstride;
          iVar11 = local_278.dfab.begin.z;
          iVar9 = local_278.dfab.end.x;
          local_278.dfab.p = local_1e0.p;
          local_278.dfab.jstride = local_1e0.jstride;
          local_278.dfab.begin.z = local_1e0.begin.z;
          local_278.dfab.end.x = local_1e0.end.x;
          if (op == COPY) {
            for (; local_1e0.p = local_278.dfab.p, local_1e0.jstride = local_278.dfab.jstride,
                local_1e0.begin.z = local_278.dfab.begin.z, local_1e0.end.x = local_278.dfab.end.x,
                pFVar17 != pFVar3; pFVar17 = pFVar17 + 1) {
              pCVar4 = pFVar17->sfab;
              local_278.offset.x = (pFVar17->offset).vect[0];
              local_278.offset.y = (pFVar17->offset).vect[1];
              local_278.sfab.p = (pCVar4->super_FArrayBox).super_BaseFab<double>.dptr;
              local_278.sfab.ncomp = (pCVar4->super_FArrayBox).super_BaseFab<double>.nvar;
              pBVar1 = &(pCVar4->super_FArrayBox).super_BaseFab<double>.domain;
              local_278.sfab.begin.z =
                   (pCVar4->super_FArrayBox).super_BaseFab<double>.domain.smallend.vect[2];
              local_278.sfab.begin.x = (pBVar1->smallend).vect[0];
              local_278.sfab.begin.y = (pBVar1->smallend).vect[1];
              lVar13 = (long)(pCVar4->super_FArrayBox).super_BaseFab<double>.domain.bigend.vect[1] +
                       1;
              iVar11 = (pCVar4->super_FArrayBox).super_BaseFab<double>.domain.bigend.vect[0];
              lVar14 = (long)(pCVar4->super_FArrayBox).super_BaseFab<double>.domain.bigend.vect[2] +
                       1;
              local_278.sfab.jstride = ((long)iVar11 - (long)(pBVar1->smallend).vect[0]) + 1;
              local_278.sfab.kstride =
                   (lVar13 - (pCVar4->super_FArrayBox).super_BaseFab<double>.domain.smallend.vect[1]
                   ) * local_278.sfab.jstride;
              local_278.sfab.nstride = (lVar14 - local_278.sfab.begin.z) * local_278.sfab.kstride;
              local_278.sfab.end._0_8_ = (ulong)(iVar11 + 1) | lVar13 << 0x20;
              local_278.offset.z = (pFVar17->offset).vect[2];
              local_278.dfab.begin.x = local_1e0.begin.x;
              local_278.dfab.begin.y = local_1e0.begin.y;
              local_278.dfab.kstride._0_4_ = (undefined4)local_1e0.kstride;
              local_278.dfab.kstride._4_4_ = (undefined4)((ulong)local_1e0.kstride >> 0x20);
              local_278.dfab.nstride._0_4_ = (undefined4)local_1e0.nstride;
              local_278.dfab.nstride._4_4_ = (undefined4)((ulong)local_1e0.nstride >> 0x20);
              local_278.sfab.end.z = (int)lVar14;
              local_278.dcomp = dcomp;
              local_278.scomp = scomp;
              LoopConcurrentOnCpu<amrex::FabArray<amrex::CutFab>::PC_local_cpu(amrex::FabArrayBase::CPC_const&,amrex::FabArray<amrex::CutFab>const&,int,int,int,amrex::FabArrayBase::CpOp)::_lambda(int,int,int,int)_1_>
                        (&pFVar17->dbox,ncomp,&local_278);
              pCVar4 = (CutFab *)local_278.dfab.p;
              LVar8 = local_278.dfab.jstride;
              iVar11 = local_278.dfab.begin.z;
              iVar9 = local_278.dfab.end.x;
              local_278.dfab.p = local_1e0.p;
              local_278.dfab.jstride = local_1e0.jstride;
              local_278.dfab.begin.z = local_1e0.begin.z;
              local_278.dfab.end.x = local_1e0.end.x;
            }
          }
          else {
            for (; local_1e0.p = local_278.dfab.p, local_1e0.jstride = local_278.dfab.jstride,
                local_1e0.begin.z = local_278.dfab.begin.z, local_1e0.end.x = local_278.dfab.end.x,
                pFVar17 != pFVar3; pFVar17 = pFVar17 + 1) {
              pCVar4 = pFVar17->sfab;
              local_278.offset.x = (pFVar17->offset).vect[0];
              local_278.offset.y = (pFVar17->offset).vect[1];
              local_278.sfab.p = (pCVar4->super_FArrayBox).super_BaseFab<double>.dptr;
              local_278.sfab.ncomp = (pCVar4->super_FArrayBox).super_BaseFab<double>.nvar;
              pBVar1 = &(pCVar4->super_FArrayBox).super_BaseFab<double>.domain;
              local_278.sfab.begin.z =
                   (pCVar4->super_FArrayBox).super_BaseFab<double>.domain.smallend.vect[2];
              local_278.sfab.begin.x = (pBVar1->smallend).vect[0];
              local_278.sfab.begin.y = (pBVar1->smallend).vect[1];
              lVar13 = (long)(pCVar4->super_FArrayBox).super_BaseFab<double>.domain.bigend.vect[1] +
                       1;
              iVar11 = (pCVar4->super_FArrayBox).super_BaseFab<double>.domain.bigend.vect[0];
              lVar14 = (long)(pCVar4->super_FArrayBox).super_BaseFab<double>.domain.bigend.vect[2] +
                       1;
              local_278.sfab.jstride = ((long)iVar11 - (long)(pBVar1->smallend).vect[0]) + 1;
              local_278.sfab.kstride =
                   (lVar13 - (pCVar4->super_FArrayBox).super_BaseFab<double>.domain.smallend.vect[1]
                   ) * local_278.sfab.jstride;
              local_278.sfab.nstride = (lVar14 - local_278.sfab.begin.z) * local_278.sfab.kstride;
              local_278.sfab.end._0_8_ = (ulong)(iVar11 + 1) | lVar13 << 0x20;
              local_278.offset.z = (pFVar17->offset).vect[2];
              local_278.dfab.begin.x = local_1e0.begin.x;
              local_278.dfab.begin.y = local_1e0.begin.y;
              local_278.dfab.kstride._0_4_ = (undefined4)local_1e0.kstride;
              local_278.dfab.kstride._4_4_ = (undefined4)((ulong)local_1e0.kstride >> 0x20);
              local_278.dfab.nstride._0_4_ = (undefined4)local_1e0.nstride;
              local_278.dfab.nstride._4_4_ = (undefined4)((ulong)local_1e0.nstride >> 0x20);
              local_278.sfab.end.z = (int)lVar14;
              local_278.dcomp = dcomp;
              local_278.scomp = scomp;
              LoopConcurrentOnCpu<amrex::FabArray<amrex::CutFab>::PC_local_cpu(amrex::FabArrayBase::CPC_const&,amrex::FabArray<amrex::CutFab>const&,int,int,int,amrex::FabArrayBase::CpOp)::_lambda(int,int,int,int)_2_>
                        (&pFVar17->dbox,ncomp,&local_278);
              pCVar4 = (CutFab *)local_278.dfab.p;
              LVar8 = local_278.dfab.jstride;
              iVar11 = local_278.dfab.begin.z;
              iVar9 = local_278.dfab.end.x;
              local_278.dfab.p = local_1e0.p;
              local_278.dfab.jstride = local_1e0.jstride;
              local_278.dfab.begin.z = local_1e0.begin.z;
              local_278.dfab.end.x = local_1e0.end.x;
            }
          }
          local_278.dfab.end.x = iVar9;
          local_278.dfab.begin.z = iVar11;
          local_278.dfab.jstride = LVar8;
          local_278.dfab.p = (double *)pCVar4;
          MFIter::operator++(&local_1a0);
        } while (local_1a0.currentIndex < local_1a0.endIndex);
      }
      MFIter::~MFIter(&local_1a0);
      LayoutData<amrex::Vector<amrex::FabCopyTag<amrex::CutFab>,_std::allocator<amrex::FabCopyTag<amrex::CutFab>_>_>_>
      ::~LayoutData(&local_140);
    }
  }
  return;
}

Assistant:

void
FabArray<FAB>::PC_local_cpu (const CPC& thecpc, FabArray<FAB> const& src,
                             int scomp, int dcomp, int ncomp, CpOp op)
{
    int N_locs = thecpc.m_LocTags->size();
    if (N_locs == 0) return;
    bool is_thread_safe = thecpc.m_threadsafe_loc;

    if (is_thread_safe)
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel for
#endif
        for (int i = 0; i < N_locs; ++i)
        {
            const CopyComTag& tag = (*thecpc.m_LocTags)[i];
            if (this != &src || tag.dstIndex != tag.srcIndex || tag.sbox != tag.dbox) {
                // avoid self copy or plus
                const FAB* sfab = &(src[tag.srcIndex]);
                      FAB* dfab = &(get(tag.dstIndex));
                if (op == FabArrayBase::COPY)
                {
                    dfab->template copy<RunOn::Host>(*sfab, tag.sbox, scomp, tag.dbox, dcomp, ncomp);
                }
                else
                {
                    dfab->template plus<RunOn::Host>(*sfab, tag.sbox, tag.dbox, scomp, dcomp, ncomp);
                }
            }
        }
    }
    else
    {
        LayoutData<Vector<FabCopyTag<FAB> > > loc_copy_tags(boxArray(),DistributionMap());
        for (int i = 0; i < N_locs; ++i)
        {
            const CopyComTag& tag = (*thecpc.m_LocTags)[i];
            if (this != &src || tag.dstIndex != tag.srcIndex || tag.sbox != tag.dbox) {
                loc_copy_tags[tag.dstIndex].push_back
                    ({src.fabPtr(tag.srcIndex), tag.dbox, tag.sbox.smallEnd()-tag.dbox.smallEnd()});
            }
        }

#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
        for (MFIter mfi(*this); mfi.isValid(); ++mfi)
        {
            const auto& tags = loc_copy_tags[mfi];
            auto dfab = this->array(mfi);
            if (op == FabArrayBase::COPY)
            {
                for (auto const & tag : tags)
                {
                    auto const sfab = tag.sfab->array();
                    Dim3 offset = tag.offset.dim3();
                    amrex::LoopConcurrentOnCpu (tag.dbox, ncomp,
                    [=] (int i, int j, int k, int n) noexcept
                    {
                        dfab(i,j,k,dcomp+n) = sfab(i+offset.x,j+offset.y,k+offset.z,scomp+n);
                    });
                }
            }
            else
            {
                for (auto const & tag : tags)
                {
                    auto const sfab = tag.sfab->array();
                    Dim3 offset = tag.offset.dim3();
                    amrex::LoopConcurrentOnCpu (tag.dbox, ncomp,
                    [=] (int i, int j, int k, int n) noexcept
                    {
                        dfab(i,j,k,dcomp+n) += sfab(i+offset.x,j+offset.y,k+offset.z,scomp+n);
                    });
                }
            }
        }
    }
}